

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O2

int xmlC14NExecute(xmlDocPtr doc,xmlC14NIsVisibleCallback is_visible_callback,void *user_data,
                  int mode,xmlChar **inclusive_ns_prefixes,int with_comments,xmlOutputBufferPtr buf)

{
  int iVar1;
  xmlC14NCtxPtr ctxt;
  xmlC14NVisibleNsStackPtr p_Var2;
  char *pcVar3;
  
  if (doc == (xmlDocPtr)0x0 || buf == (xmlOutputBufferPtr)0x0) {
    pcVar3 = "executing c14n";
  }
  else {
    if ((uint)mode < 3) {
      if (buf->encoder == (xmlCharEncodingHandlerPtr)0x0) {
        ctxt = (xmlC14NCtxPtr)(*xmlMalloc)(0x50);
        if (ctxt == (xmlC14NCtxPtr)0x0) {
          xmlC14NErrMemory("creating context");
        }
        else {
          *(undefined8 *)&ctxt->with_comments = 0;
          ctxt->buf = (xmlOutputBufferPtr)0x0;
          *(undefined8 *)&ctxt->error = 0;
          ctxt->pos = XMLC14N_BEFORE_DOCUMENT_ELEMENT;
          ctxt->parent_is_doc = 0;
          ctxt->ns_rendered = (xmlC14NVisibleNsStackPtr)0x0;
          *(undefined8 *)&ctxt->mode = 0;
          ctxt->inclusive_ns_prefixes = (xmlChar **)0x0;
          ctxt->doc = doc;
          ctxt->with_comments = with_comments;
          ctxt->is_visible_callback = is_visible_callback;
          ctxt->user_data = user_data;
          ctxt->buf = buf;
          ctxt->parent_is_doc = 1;
          p_Var2 = (xmlC14NVisibleNsStackPtr)(*xmlMalloc)(0x20);
          if (p_Var2 != (xmlC14NVisibleNsStackPtr)0x0) {
            p_Var2->nsTab = (xmlNsPtr *)0x0;
            p_Var2->nodeTab = (xmlNodePtr *)0x0;
            p_Var2->nsCurEnd = 0;
            p_Var2->nsPrevStart = 0;
            p_Var2->nsPrevEnd = 0;
            p_Var2->nsMax = 0;
            ctxt->ns_rendered = p_Var2;
            ctxt->mode = mode;
            if (mode == 1) {
              ctxt->inclusive_ns_prefixes = inclusive_ns_prefixes;
            }
            if ((doc->children == (xmlNodePtr)0x0) ||
               (iVar1 = xmlC14NProcessNodeList(ctxt,doc->children), -1 < iVar1)) {
              iVar1 = xmlOutputBufferFlush(buf);
              if (-1 < iVar1) {
                xmlC14NFreeCtx(ctxt);
                return iVar1;
              }
              pcVar3 = "flushing output buffer";
            }
            else {
              pcVar3 = "processing docs children list";
            }
            xmlC14NErrInternal(pcVar3);
            xmlC14NFreeCtx(ctxt);
            return -1;
          }
          xmlC14NErrMemory("creating namespaces stack");
          ctxt->ns_rendered = (xmlC14NVisibleNsStackPtr)0x0;
          xmlC14NErr(ctxt,(xmlNodePtr)doc,0x7a0,
                     "xmlC14NNewCtx: xmlC14NVisibleNsStackCreate failed\n");
          xmlC14NFreeCtx(ctxt);
        }
        pcVar3 = "xmlC14NExecute: unable to create C14N context\n";
        iVar1 = 0x79e;
      }
      else {
        pcVar3 = "xmlC14NExecute: output buffer encoder != NULL but C14N requires UTF8 output\n";
        iVar1 = 0x79f;
      }
      xmlC14NErr((xmlC14NCtxPtr)0x0,(xmlNodePtr)doc,iVar1,pcVar3);
      return -1;
    }
    pcVar3 = "invalid mode for executing c14n";
  }
  xmlC14NErrParam(pcVar3);
  return -1;
}

Assistant:

int
xmlC14NExecute(xmlDocPtr doc, xmlC14NIsVisibleCallback is_visible_callback,
	 void* user_data, int mode, xmlChar **inclusive_ns_prefixes,
	 int with_comments, xmlOutputBufferPtr buf) {

    xmlC14NCtxPtr ctx;
    xmlC14NMode c14n_mode = XML_C14N_1_0;
    int ret;

    if ((buf == NULL) || (doc == NULL)) {
        xmlC14NErrParam("executing c14n");
        return (-1);
    }

    /* for backward compatibility, we have to have "mode" as "int"
       and here we check that user gives valid value */
    switch(mode) {
    case XML_C14N_1_0:
    case XML_C14N_EXCLUSIVE_1_0:
    case XML_C14N_1_1:
         c14n_mode = (xmlC14NMode)mode;
         break;
    default:
        xmlC14NErrParam("invalid mode for executing c14n");
        return (-1);
    }

    /*
     *  Validate the encoding output buffer encoding
     */
    if (buf->encoder != NULL) {
        xmlC14NErr(NULL, (xmlNodePtr) doc, XML_C14N_REQUIRES_UTF8,
"xmlC14NExecute: output buffer encoder != NULL but C14N requires UTF8 output\n");
        return (-1);
    }

    ctx = xmlC14NNewCtx(doc, is_visible_callback, user_data,
	            c14n_mode, inclusive_ns_prefixes,
                    with_comments, buf);
    if (ctx == NULL) {
        xmlC14NErr(NULL, (xmlNodePtr) doc, XML_C14N_CREATE_CTXT,
		   "xmlC14NExecute: unable to create C14N context\n");
        return (-1);
    }



    /*
     * Root Node
     * The root node is the parent of the top-level document element. The
     * result of processing each of its child nodes that is in the node-set
     * in document order. The root node does not generate a byte order mark,
     * XML declaration, nor anything from within the document type
     * declaration.
     */
    if (doc->children != NULL) {
        ret = xmlC14NProcessNodeList(ctx, doc->children);
        if (ret < 0) {
            xmlC14NErrInternal("processing docs children list");
            xmlC14NFreeCtx(ctx);
            return (-1);
        }
    }

    /*
     * Flush buffer to get number of bytes written
     */
    ret = xmlOutputBufferFlush(buf);
    if (ret < 0) {
        xmlC14NErrInternal("flushing output buffer");
        xmlC14NFreeCtx(ctx);
        return (-1);
    }

    /*
     * Cleanup
     */
    xmlC14NFreeCtx(ctx);
    return (ret);
}